

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  TestPartResult *pTVar7;
  long *plVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  string *value;
  size_type *psVar11;
  TimeInMillis ms;
  TimeInMillis ms_00;
  long lVar12;
  int iVar13;
  int i;
  _Alloc_hider _Var14;
  char *pcVar15;
  internal *this;
  TestResult *this_00;
  string summary;
  string location;
  string detail;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string kTestsuite;
  string local_e0;
  string local_c0;
  allocator local_99;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  char local_68 [16];
  TestResult *local_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"testcase","");
  if (test_info->is_in_another_shard_ != false) goto LAB_00125bbf;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"    <testcase",0xd);
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
  std::__cxx11::string::string
            ((string *)&local_e0,(test_info->name_)._M_dataplus._M_p,(allocator *)local_98);
  OutputXmlAttribute(stream,&local_50,&local_c0,&local_e0);
  paVar2 = &local_e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  pbVar3 = (test_info->value_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"value_param","");
    pbVar3 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var14._M_p = (char *)0x0;
    }
    else {
      _Var14._M_p = (pbVar3->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_e0,_Var14._M_p,(allocator *)local_98);
    OutputXmlAttribute(stream,&local_50,&local_c0,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  pbVar3 = (test_info->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"type_param","");
    pbVar3 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var14._M_p = (char *)0x0;
    }
    else {
      _Var14._M_p = (pbVar3->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_e0,_Var14._M_p,(allocator *)local_98);
    OutputXmlAttribute(stream,&local_50,&local_c0,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"file","");
    std::__cxx11::string::string
              ((string *)&local_e0,(test_info->location_).file._M_dataplus._M_p,
               (allocator *)local_98);
    OutputXmlAttribute(stream,&local_50,&local_c0,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"line","");
    local_98._0_4_ = (test_info->location_).line;
    StreamableToString<int>(&local_e0,(int *)local_98);
    OutputXmlAttribute(stream,&local_50,&local_c0,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream," />\n",4);
    goto LAB_00125bbf;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"status","");
  pcVar15 = "notrun";
  if ((ulong)test_info->should_run_ != 0) {
    pcVar15 = "run";
  }
  local_e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,pcVar15,pcVar15 + ((ulong)test_info->should_run_ ^ 1) * 3 + 3);
  OutputXmlAttribute(stream,&local_50,&local_c0,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"result","");
  local_58 = &test_info->result_;
  if (test_info->should_run_ == true) {
    bVar4 = TestResult::Skipped(local_58);
    pcVar15 = "completed";
    if (bVar4) {
      pcVar15 = "skipped";
    }
  }
  else {
    pcVar15 = "suppressed";
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  sVar6 = strlen(pcVar15);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar15,pcVar15 + sVar6);
  OutputXmlAttribute(stream,&local_50,&local_c0,&local_e0);
  paVar2 = &local_e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"time","");
  FormatTimeInMillisAsSeconds_abi_cxx11_
            (&local_e0,(internal *)(test_info->result_).elapsed_time_,ms);
  OutputXmlAttribute(stream,&local_50,&local_c0,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"timestamp","");
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_
            (&local_e0,(internal *)(test_info->result_).start_timestamp_,ms_00);
  OutputXmlAttribute(stream,&local_50,&local_c0,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"classname","");
  std::__cxx11::string::string((string *)&local_e0,test_suite_name,(allocator *)local_98);
  value = &local_e0;
  OutputXmlAttribute(stream,&local_50,&local_c0,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  this_00 = local_58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((int)((ulong)((long)(test_info->result_).test_part_results_.
                          super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(test_info->result_).test_part_results_.
                         super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249 < 1) {
LAB_00125b65:
    if ((int)((ulong)((long)(test_info->result_).test_properties_.
                            super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(test_info->result_).test_properties_.
                           super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
      goto LAB_00125b90;
    }
    lVar12 = 4;
    pcVar15 = " />\n";
  }
  else {
    i = 0;
    iVar13 = 0;
    do {
      pTVar7 = TestResult::GetTestPartResult(this_00,i);
      iVar5 = (int)value;
      this_00 = local_58;
      if (pTVar7->type_ - kNonFatalFailure < 2) {
        if (iVar13 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
        }
        this = (internal *)(pTVar7->file_name_)._M_string_length;
        if (this != (internal *)0x0) {
          this = (internal *)(pTVar7->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_c0,this,(char *)(ulong)(uint)pTVar7->line_number_,iVar5);
        local_98._0_8_ = local_98 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,local_c0._M_dataplus._M_p,
                   local_c0._M_dataplus._M_p + local_c0._M_string_length);
        std::__cxx11::string::append((char *)local_98);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_98);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_e0.field_2._M_allocated_capacity = *psVar11;
          local_e0.field_2._8_8_ = plVar8[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar11;
          local_e0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_e0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"      <failure message=\"",0x18);
        std::__cxx11::string::string
                  ((string *)local_78._M_local_buf,local_e0._M_dataplus._M_p,&local_99);
        EscapeXml((string *)local_98,(string *)&local_78,true);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(char *)local_98._0_8_,local_98._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" type=\"\">",10);
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_);
        }
        if ((char *)local_78._M_allocated_capacity != local_68) {
          operator_delete((void *)local_78._M_allocated_capacity);
        }
        local_78._M_allocated_capacity = (size_type)local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,local_c0._M_dataplus._M_p,
                   local_c0._M_dataplus._M_p + local_c0._M_string_length);
        std::__cxx11::string::append(local_78._M_local_buf);
        puVar10 = (undefined8 *)std::__cxx11::string::append(local_78._M_local_buf);
        this_00 = local_58;
        local_98._0_8_ = local_98 + 0x10;
        value = (string *)(puVar10 + 2);
        if ((string *)*puVar10 == value) {
          local_98._16_8_ = (value->_M_dataplus)._M_p;
          local_98._24_8_ = puVar10[3];
        }
        else {
          local_98._16_8_ = (value->_M_dataplus)._M_p;
          local_98._0_8_ = (string *)*puVar10;
        }
        local_98._8_8_ = puVar10[1];
        *puVar10 = value;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        if ((char *)local_78._M_allocated_capacity != local_68) {
          operator_delete((void *)local_78._M_allocated_capacity);
        }
        RemoveInvalidXmlCharacters((string *)&local_78,(string *)local_98);
        OutputXmlCDataSection(stream,(char *)local_78._M_allocated_capacity);
        if ((char *)local_78._M_allocated_capacity != local_68) {
          operator_delete((void *)local_78._M_allocated_capacity);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"</failure>\n",0xb);
        if ((string *)local_98._0_8_ != (string *)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        iVar13 = iVar13 + 1;
      }
      i = i + 1;
      iVar5 = (int)((ulong)((long)(test_info->result_).test_part_results_.
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(test_info->result_).test_part_results_.
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(i,iVar5 * -0x49249249) != i + iVar5 * 0x49249249 < 0);
    if (iVar13 == 0) goto LAB_00125b65;
LAB_00125b90:
    OutputXmlTestProperties(stream,this_00);
    lVar12 = 0x10;
    pcVar15 = "    </testcase>\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar15,lVar12);
LAB_00125bbf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_suite_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestsuite, "name", test_info.name());

  if (test_info.value_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "type_param",
                       test_info.type_param());
  }
  if (GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "file", test_info.file());
    OutputXmlAttribute(stream, kTestsuite, "line",
                       StreamableToString(test_info.line()));
    *stream << " />\n";
    return;
  }

  OutputXmlAttribute(stream, kTestsuite, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestsuite, "result",
                     test_info.should_run()
                         ? (result.Skipped() ? "skipped" : "completed")
                         : "suppressed");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuite, "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuite, "classname", test_suite_name);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}